

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

ssize_t __thiscall
httplib::detail::SSLSocketStream::read(SSLSocketStream *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  uint ret_code;
  int num;
  undefined4 in_register_00000034;
  void *buf;
  ulong uVar2;
  
  buf = (void *)CONCAT44(in_register_00000034,__fd);
  iVar1 = SSL_pending((SSL *)this->ssl_);
  num = (int)__buf;
  if (iVar1 < 1) {
    iVar1 = (*(this->super_Stream)._vptr_Stream[2])(this);
    uVar2 = 0xffffffffffffffff;
    if ((char)iVar1 != '\0') {
      ret_code = SSL_read((SSL *)this->ssl_,buf,num);
      if ((int)ret_code < 0) {
        do {
          iVar1 = SSL_get_error((SSL *)this->ssl_,ret_code);
          if (iVar1 != 2) goto LAB_00109195;
          iVar1 = SSL_pending((SSL *)this->ssl_);
          if (0 < iVar1) goto LAB_0010915a;
          iVar1 = (*(this->super_Stream)._vptr_Stream[2])(this);
          if ((char)iVar1 == '\0') {
            return -1;
          }
          ret_code = SSL_read((SSL *)this->ssl_,buf,num);
        } while ((int)ret_code < 0);
        uVar2 = (ulong)ret_code;
      }
      else {
LAB_00109195:
        uVar2 = (ulong)(int)ret_code;
      }
    }
  }
  else {
LAB_0010915a:
    iVar1 = SSL_read((SSL *)this->ssl_,buf,num);
    uVar2 = (ulong)iVar1;
  }
  return uVar2;
}

Assistant:

inline ssize_t SSLSocketStream::read(char *ptr, size_t size) {
  if (SSL_pending(ssl_) > 0) {
    return SSL_read(ssl_, ptr, static_cast<int>(size));
  } else if (is_readable()) {
    auto ret = SSL_read(ssl_, ptr, static_cast<int>(size));
    if (ret < 0) {
      auto err = SSL_get_error(ssl_, ret);
      while (err == SSL_ERROR_WANT_READ) {
        if (SSL_pending(ssl_) > 0) {
          return SSL_read(ssl_, ptr, static_cast<int>(size));
        } else if (is_readable()) {
          ret = SSL_read(ssl_, ptr, static_cast<int>(size));
          if (ret >= 0) { return ret; }
          err = SSL_get_error(ssl_, ret);
        } else {
          return -1;
        }
      }
    }
    return ret;
  }
  return -1;
}